

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaShow.c
# Opt level: O1

Vec_Int_t * Gia_ShowMapAdds(Gia_Man_t *p,Vec_Int_t *vAdds,int fFadds,Vec_Int_t *vBold)

{
  uint *puVar1;
  uint uVar2;
  int iVar3;
  uint uVar4;
  uint uVar5;
  int *piVar6;
  void *__s;
  Vec_Int_t *pVVar7;
  int *__s_00;
  uint uVar8;
  int iVar9;
  int iVar10;
  long lVar11;
  int iVar12;
  
  uVar2 = p->nObjs;
  iVar12 = (((int)uVar2 >> 5) + 1) - (uint)((uVar2 & 0x1f) == 0);
  if (iVar12 == 0) {
    __s = (void *)0x0;
  }
  else {
    __s = malloc((long)iVar12 * 4);
  }
  memset(__s,0,(long)iVar12 << 2);
  pVVar7 = (Vec_Int_t *)malloc(0x10);
  uVar8 = 0x10;
  if (0xe < uVar2 - 1) {
    uVar8 = uVar2;
  }
  pVVar7->nSize = 0;
  pVVar7->nCap = uVar8;
  if (uVar8 == 0) {
    __s_00 = (int *)0x0;
  }
  else {
    __s_00 = (int *)malloc((long)(int)uVar8 << 2);
  }
  pVVar7->pArray = __s_00;
  pVVar7->nSize = uVar2;
  if (__s_00 != (int *)0x0) {
    memset(__s_00,0xff,(long)(int)uVar2 << 2);
  }
  iVar12 = iVar12 * 0x20;
  if ((vBold != (Vec_Int_t *)0x0) && (iVar3 = vBold->nSize, 0 < (long)iVar3)) {
    piVar6 = vBold->pArray;
    lVar11 = 0;
    do {
      uVar8 = piVar6[lVar11];
      if (((int)uVar8 < 0) || (iVar12 <= (int)uVar8)) {
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecBit.h"
                      ,0x132,"void Vec_BitWriteEntry(Vec_Bit_t *, int, int)");
      }
      puVar1 = (uint *)((long)__s + (ulong)(uVar8 >> 5) * 4);
      *puVar1 = *puVar1 | 1 << ((byte)uVar8 & 0x1f);
      lVar11 = lVar11 + 1;
    } while (iVar3 != lVar11);
  }
  iVar3 = vAdds->nSize;
  if (0 < iVar3) {
    iVar9 = 0;
    uVar8 = 4;
    do {
      if (fFadds == 0) {
LAB_007b2125:
        if (iVar3 <= (int)(uVar8 - 1)) {
LAB_007b21e0:
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                        ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
        }
        piVar6 = vAdds->pArray;
        uVar4 = piVar6[uVar8 - 1];
        if (((int)uVar4 < 0) || (iVar12 <= (int)uVar4)) {
LAB_007b21ff:
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecBit.h"
                        ,0x121,"int Vec_BitEntry(Vec_Bit_t *, int)");
        }
        if ((*(uint *)((long)__s + (ulong)(uVar4 >> 5) * 4) >> (uVar4 & 0x1f) & 1) == 0) {
          if (iVar3 <= (int)uVar8) goto LAB_007b21e0;
          uVar5 = piVar6[uVar8];
          if (((int)uVar5 < 0) || (iVar12 <= (int)uVar5)) goto LAB_007b21ff;
          if ((*(uint *)((long)__s + (ulong)(uVar5 >> 5) * 4) >> (uVar5 & 0x1f) & 1) == 0) {
            if ((int)uVar2 <= (int)uVar4) {
LAB_007b223d:
              __assert_fail("i >= 0 && i < p->nSize",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                            ,0x1cb,"void Vec_IntWriteEntry(Vec_Int_t *, int, int)");
            }
            __s_00[uVar4] = iVar9;
            iVar10 = piVar6[uVar8];
            if (((long)iVar10 < 0) || ((int)uVar2 <= iVar10)) goto LAB_007b223d;
            __s_00[iVar10] = iVar9;
          }
        }
      }
      else {
        if (iVar3 <= (int)(uVar8 - 2)) goto LAB_007b21e0;
        if (vAdds->pArray[uVar8 - 2] != 0) goto LAB_007b2125;
      }
      iVar9 = iVar9 + 1;
      iVar10 = uVar8 + 2;
      uVar8 = uVar8 + 6;
    } while (iVar10 < iVar3);
  }
  if (__s != (void *)0x0) {
    free(__s);
  }
  return pVVar7;
}

Assistant:

Vec_Int_t * Gia_ShowMapAdds( Gia_Man_t * p, Vec_Int_t * vAdds, int fFadds, Vec_Int_t * vBold )
{
    Vec_Bit_t * vIsBold = Vec_BitStart( Gia_ManObjNum(p) );
    Vec_Int_t * vMapAdds = Vec_IntStartFull( Gia_ManObjNum(p) ); int i, Entry;
    if ( vBold )
        Vec_IntForEachEntry( vBold, Entry, i )
            Vec_BitWriteEntry( vIsBold, Entry, 1 );
    for ( i = 0; 6*i < Vec_IntSize(vAdds); i++ )
    {
        if ( fFadds && Vec_IntEntry(vAdds, 6*i+2) == 0 )
            continue;
        if ( Vec_BitEntry(vIsBold, Vec_IntEntry(vAdds, 6*i+3)) || Vec_BitEntry(vIsBold, Vec_IntEntry(vAdds, 6*i+4)) )
            continue;
        Vec_IntWriteEntry( vMapAdds, Vec_IntEntry(vAdds, 6*i+3), i );
        Vec_IntWriteEntry( vMapAdds, Vec_IntEntry(vAdds, 6*i+4), i );
    }
    Vec_BitFree( vIsBold );
    return vMapAdds;
}